

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O2

void Abc_ObjChangePerform
               (Abc_Obj_t *pObj,Vec_Int_t *vInfo,Vec_Int_t *vFirst,int fUseInv,Vec_Int_t *vTemp,
               Vec_Ptr_t *vFanout,Vec_Ptr_t *vFanout2,Mio_Cell2_t *pCells)

{
  uint iFanin;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pObj_00;
  
  iVar1 = Mio_GateReadCell((Mio_Gate_t *)(pObj->field_5).pData);
  iVar1 = Vec_IntEntry(vFirst,iVar1);
  piVar4 = Vec_IntEntryP(vInfo,iVar1);
  iFanin = (pObj->vFanins).nSize;
  if (((int)iFanin < 1) || (piVar4[(ulong)iFanin * 3] == -1)) {
    __assert_fail("iFanin > 0 && pNodeInfo[3*iFanin] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                  ,0x11f,
                  "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                 );
  }
  Abc_NodeCollectFanouts(pObj,vFanout);
  iVar1 = Abc_NodeIsInv(pObj);
  if (iVar1 == 0) {
    Abc_ObjChangeUpdate(pObj,iFanin,pCells,piVar4,vTemp);
  }
  else {
    pAVar6 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
    for (iVar1 = 0; iVar1 < vFanout->nSize; iVar1 = iVar1 + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(vFanout,iVar1);
      Abc_ObjPatchFanin(pAVar5,pObj,pAVar6);
    }
    if ((pObj->vFanouts).nSize != 0) {
      __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                    ,0x127,
                    "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                   );
    }
    Abc_NtkDeleteObj(pObj);
    pObj = pAVar6;
  }
  iVar1 = 0;
  if (fUseInv == 0) {
    pAVar6 = (Abc_Obj_t *)0x0;
  }
  else {
    pAVar6 = Abc_NtkCreateNodeInv(pObj->pNtk,pObj);
  }
  do {
    if (vFanout->nSize <= iVar1) {
      return;
    }
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(vFanout,iVar1);
    if (((*(uint *)&pAVar5->field_0x14 & 0xf) == 7) && (iVar2 = Abc_NodeIsBuf(pAVar5), iVar2 == 0))
    {
      iVar2 = Abc_NodeIsInv(pAVar5);
      if (iVar2 == 0) {
        iVar2 = Abc_NodeFindFanin(pAVar5,pObj);
        iVar3 = Mio_GateReadCell((Mio_Gate_t *)(pAVar5->field_5).pData);
        iVar3 = Vec_IntEntry(vFirst,iVar3);
        piVar4 = Vec_IntEntryP(vInfo,iVar3);
        if (piVar4[iVar2 * 3] == -1) goto LAB_00445b31;
        Abc_ObjChangeUpdate(pAVar5,iVar2,pCells,piVar4,vTemp);
      }
      else {
        Abc_NodeCollectFanouts(pAVar5,vFanout2);
        for (iVar2 = 0; iVar2 < vFanout2->nSize; iVar2 = iVar2 + 1) {
          pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vFanout2,iVar2);
          Abc_ObjPatchFanin(pObj_00,pAVar5,pObj);
        }
        if ((pAVar5->vFanouts).nSize != 0) {
          __assert_fail("Abc_ObjFanoutNum(pNext) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                        ,0x13e,
                        "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                       );
        }
        Abc_NtkDeleteObj(pAVar5);
      }
    }
    else {
LAB_00445b31:
      Abc_ObjPatchFanin(pAVar5,pObj,pAVar6);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void Abc_ObjChangePerform( Abc_Obj_t * pObj, Vec_Int_t * vInfo, Vec_Int_t * vFirst, int fUseInv, Vec_Int_t * vTemp, Vec_Ptr_t * vFanout, Vec_Ptr_t * vFanout2, Mio_Cell2_t * pCells )
{
    Abc_Obj_t * pNext, * pNext2, * pNodeInv = NULL;
    int iFanCell, iNodeCell = Mio_GateReadCell( (Mio_Gate_t *)pObj->pData );
    int * pFanInfo, * pNodeInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iNodeCell) );
    int i, k, iFanin = Abc_ObjFaninNum(pObj);
    assert( iFanin > 0 && pNodeInfo[3*iFanin] != -1 );
    // update the node
    Abc_NodeCollectFanouts( pObj, vFanout );
    if ( Abc_NodeIsInv(pObj) )
    {
        Abc_Obj_t * pFanin = Abc_ObjFanin0(pObj);
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanout, pNext, k )
            Abc_ObjPatchFanin( pNext, pObj, pFanin );
        assert( Abc_ObjFanoutNum(pObj) == 0 );
        Abc_NtkDeleteObj(pObj);
        pObj = pFanin;
//        assert( fUseInv == 0 );
    }
    else
        Abc_ObjChangeUpdate( pObj, iFanin, pCells, pNodeInfo, vTemp );
    // add inverter if needed
    if ( fUseInv )
        pNodeInv = Abc_NtkCreateNodeInv(pObj->pNtk, pObj);
    // update the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanout, pNext, i )
    {
        if ( !Abc_ObjIsNode(pNext) || Abc_NodeIsBuf(pNext) )
        {
            Abc_ObjPatchFanin( pNext, pObj, pNodeInv );
            continue;
        }
        if ( Abc_NodeIsInv(pNext) )
        {
            Abc_NodeCollectFanouts( pNext, vFanout2 );
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanout2, pNext2, k )
                Abc_ObjPatchFanin( pNext2, pNext, pObj );
            assert( Abc_ObjFanoutNum(pNext) == 0 );
            Abc_NtkDeleteObj(pNext);
            continue;
        }
        iFanin   = Abc_NodeFindFanin( pNext, pObj );
        iFanCell = Mio_GateReadCell( (Mio_Gate_t *)pNext->pData );
        pFanInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iFanCell) );
        if ( pFanInfo[3*iFanin] == -1 )
        {
            Abc_ObjPatchFanin( pNext, pObj, pNodeInv );
            continue;
        }
        Abc_ObjChangeUpdate( pNext, iFanin, pCells, pFanInfo, vTemp );
    }
}